

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O2

void __thiscall
ki::protocol::control::SessionAccept::read_from(SessionAccept *this,istream *istream)

{
  Field<int> *pFVar1;
  Field<unsigned_int> *pFVar2;
  Field<unsigned_short> *pFVar3;
  string sStack_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  Record record;
  ostringstream oss;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_238,"unknown",(allocator *)&oss);
  ki::dml::Record::add_field<unsigned_short>(&record,&local_238,true);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_258,"unknown2",(allocator *)&oss);
  ki::dml::Record::add_field<unsigned_int>(&record,&local_258,true);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&local_278,"m_timestamp",(allocator *)&oss);
  pFVar1 = ki::dml::Record::add_field<int>(&record,&local_278,true);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string((string *)&local_298,"m_milliseconds",(allocator *)&oss);
  pFVar2 = ki::dml::Record::add_field<unsigned_int>(&record,&local_298,true);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&sStack_2b8,"m_session_id",(allocator *)&oss);
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(&record,&sStack_2b8,true);
  std::__cxx11::string::~string((string *)&sStack_2b8);
  ki::dml::Record::read_from(&record,istream);
  this->m_timestamp = pFVar1->m_value;
  this->m_milliseconds = pFVar2->m_value;
  this->m_session_id = pFVar3->m_value;
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void SessionAccept::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		auto *milliseconds = record.add_field<dml::UINT>("m_milliseconds");
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading SessionAccept payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
		m_milliseconds = milliseconds->get_value();
		m_session_id = session_id->get_value();
	}